

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# from_csr.hpp
# Opt level: O0

void run<unsigned_int,double,std::map<unsigned_int,double,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>>
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *A_rows,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *A_cols,
               vector<double,_std::allocator<double>_> *A_values,
               vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
               *B)

{
  value_type vVar1;
  uint uVar2;
  size_type sVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  mapped_type *pmVar6;
  vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
  *in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
  *in_RSI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  uint nnz_index;
  uint row_stop;
  size_t row;
  uint row_start;
  size_t N;
  undefined4 local_40;
  size_type in_stack_ffffffffffffffc8;
  ulong uVar7;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RDI);
  std::
  vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
  ::resize((vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
            *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
           in_stack_ffffffffffffffc8);
  pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](in_RDI,0);
  local_40 = *pvVar4;
  for (uVar7 = 0; uVar7 < sVar3 - 1; uVar7 = uVar7 + 1) {
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](in_RDI,uVar7 + 1);
    uVar2 = *pvVar4;
    for (; local_40 < uVar2; local_40 = local_40 + 1) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,(ulong)local_40);
      vVar1 = *pvVar5;
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RSI,
                          (ulong)local_40);
      std::
      vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
      ::operator[](in_RCX,(ulong)*pvVar4);
      pmVar6 = std::
               map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
               ::operator[](in_RSI,(key_type *)in_RDX);
      *pmVar6 = vVar1;
    }
    local_40 = uVar2;
  }
  do_nothing(in_RCX);
  return;
}

Assistant:

void run(std::vector<IndexT> const & A_rows, std::vector<IndexT> const & A_cols, std::vector<NumericT> const & A_values,
         std::vector<RowT> & B)
{
  std::size_t N = A_rows.size() - 1;
  B.resize(N);

  IndexT row_start = A_rows[0];
  for (std::size_t row = 0; row < N; ++row)
  {
    IndexT row_stop  = A_rows[row+1];

    for (IndexT nnz_index = row_start; nnz_index < row_stop; ++nnz_index)
      B[A_cols[nnz_index]][row] = A_values[nnz_index];

    row_start = row_stop;
  }

  do_nothing(B);
}